

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_helpers.c
# Opt level: O0

int kvtree_unpack_uint32_t(void *buf,size_t buf_size,size_t *buf_pos,uint32_t *val)

{
  __uint32_t _Var1;
  ulong uVar2;
  uint32_t val_network;
  size_t pos_final;
  size_t pos;
  uint32_t *val_local;
  size_t *buf_pos_local;
  size_t buf_size_local;
  void *buf_local;
  
  if (((buf == (void *)0x0) || (buf_pos == (size_t *)0x0)) || (val == (uint32_t *)0x0)) {
    kvtree_err("NULL pointer to buffer, buffer position, or value @ %s:%d",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
               ,0xfb);
    buf_local._4_4_ = 1;
  }
  else {
    uVar2 = *buf_pos + 4;
    if (buf_size < uVar2) {
      kvtree_err("Attempting to unpack too many bytes into buffer @ %s:%d",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
                 ,0x109);
      buf_local._4_4_ = 1;
    }
    else {
      _Var1 = __bswap_32(*(__uint32_t *)((long)buf + *buf_pos));
      *val = _Var1;
      *buf_pos = uVar2;
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int kvtree_unpack_uint32_t(const void* buf, size_t buf_size, size_t* buf_pos, uint32_t* val)
{
  /* check that we have a valid pointer to a buffer position value */
  if (buf == NULL || buf_pos == NULL || val == NULL) {
    kvtree_err("NULL pointer to buffer, buffer position, or value @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* get current buffer position */
  size_t pos = *buf_pos;

  /* compute final buffer position */
  size_t pos_final = pos + sizeof(uint32_t);

  /* check that we won't overrun the buffer */
  if (pos_final > buf_size) {
    kvtree_err("Attempting to unpack too many bytes into buffer @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* read value from buffer (stored in network order) */
  uint32_t val_network;
  memcpy(&val_network, buf + pos, sizeof(val_network));

  /* conver to host order */
  *val = kvtree_ntoh32(val_network);

  /* update position */
  *buf_pos = pos_final;

  return KVTREE_SUCCESS;
}